

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O0

void GenKMPNext(int *next,CMyString *s)

{
  bool bVar1;
  int local_20;
  int local_1c;
  int j;
  int i;
  CMyString *s_local;
  int *next_local;
  
  local_1c = 0;
  local_20 = -1;
  *next = -1;
  while (local_1c < s->length + -1) {
    while( true ) {
      bVar1 = false;
      if (-1 < local_20) {
        bVar1 = s->str[local_1c] != s->str[local_20];
      }
      if (!bVar1) break;
      local_20 = next[local_20];
    }
    local_1c = local_1c + 1;
    local_20 = local_20 + 1;
    if (s->str[local_1c] == s->str[local_20]) {
      next[local_1c] = next[local_20];
    }
    else {
      next[local_1c] = local_20;
    }
  }
  return;
}

Assistant:

void GenKMPNext(int *next,CMyString *s)  //计算next数组
{
    int i = 0, j = -1;
    next[0] = -1;
    while(i < s->length-1)
    {
        //找出p0,p1,...,pi中最大的相同的最左端子串和最右端子串
        while(j>=0 && s->str[i]!=s->str[j]) {
            j = next[j];
        }
        i++; j++;
        if(s->str[i]==s->str[j])
            next[i] = next[j];
        else next[i] = j;
    }
}